

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall csguide_webserver::HttpServer::Run(HttpServer *this,int max_queue_size)

{
  bool bVar1;
  void *pvVar2;
  element_type *peVar3;
  long in_RDI;
  shared_ptr<csguide_webserver::HttpData> *req;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
  *__range2;
  vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
  events;
  __uint32_t event;
  shared_ptr<csguide_webserver::HttpData> httpData;
  int epoll_fd;
  ThreadPool threadPool;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar4;
  HttpData *in_stack_fffffffffffffe40;
  shared_ptr<csguide_webserver::HttpData> *this_00;
  undefined4 in_stack_fffffffffffffe48;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 *puVar8;
  int epoll_fd_00;
  undefined8 in_stack_fffffffffffffe78;
  ThreadPool *in_stack_fffffffffffffe80;
  TimerManager *in_stack_fffffffffffffe90;
  function<void_(std::shared_ptr<void>)> *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  ThreadPool *in_stack_fffffffffffffeb8;
  __normal_iterator<std::shared_ptr<csguide_webserver::HttpData>_*,_std::vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>_>
  local_118;
  undefined1 *local_110;
  undefined1 local_108 [24];
  undefined1 local_f0 [20];
  undefined4 local_dc;
  shared_ptr<csguide_webserver::HttpData> local_d8 [2];
  int local_b4;
  
  ThreadPool::ThreadPool
            (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (int)in_stack_fffffffffffffe78);
  local_b4 = Epoll::Init(0);
  pvVar2 = operator_new(0x58);
  epoll_fd_00 = (int)pvVar2;
  HttpData::HttpData(in_stack_fffffffffffffe40);
  std::shared_ptr<csguide_webserver::HttpData>::shared_ptr<csguide_webserver::HttpData,void>
            ((shared_ptr<csguide_webserver::HttpData> *)in_stack_fffffffffffffe40,
             (HttpData *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  this_00 = local_d8;
  iVar4 = local_b4;
  peVar3 = std::
           __shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10d8b5);
  peVar3->epoll_fd = iVar4;
  *(int *)(in_RDI + 0x1c) = local_b4;
  local_dc = 0x80000001;
  uVar6 = *(undefined4 *)(in_RDI + 0x18);
  uVar7 = 0x80000001;
  puVar8 = local_f0;
  iVar5 = local_b4;
  std::shared_ptr<csguide_webserver::HttpData>::shared_ptr
            (this_00,(shared_ptr<csguide_webserver::HttpData> *)
                     CONCAT44(iVar4,in_stack_fffffffffffffe38));
  Epoll::Addfd(epoll_fd_00,(int)((ulong)puVar8 >> 0x20),(__uint32_t)puVar8,
               (shared_ptr<csguide_webserver::HttpData> *)CONCAT44(uVar7,uVar6));
  std::shared_ptr<csguide_webserver::HttpData>::~shared_ptr
            ((shared_ptr<csguide_webserver::HttpData> *)0x10d932);
  do {
    Epoll::Poll((ServerSocket *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                in_stack_fffffffffffffeb0);
    local_110 = local_108;
    local_118._M_current =
         (shared_ptr<csguide_webserver::HttpData> *)
         std::
         vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
         ::begin((vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
                  *)CONCAT44(iVar4,in_stack_fffffffffffffe38));
    std::
    vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
    ::end((vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
           *)CONCAT44(iVar4,in_stack_fffffffffffffe38));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<csguide_webserver::HttpData>_*,_std::vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>_>
                          *)this_00,
                         (__normal_iterator<std::shared_ptr<csguide_webserver::HttpData>_*,_std::vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>_>
                          *)CONCAT44(iVar4,in_stack_fffffffffffffe38));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<csguide_webserver::HttpData>_*,_std::vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>_>
      ::operator*(&local_118);
      std::shared_ptr<void>::shared_ptr<csguide_webserver::HttpData,void>
                ((shared_ptr<void> *)this_00,
                 (shared_ptr<csguide_webserver::HttpData> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffe38));
      std::
      bind<void(csguide_webserver::HttpServer::*)(std::shared_ptr<void>),csguide_webserver::HttpServer*,std::_Placeholder<1>const&>
                ((offset_in_HttpServer_to_subr *)CONCAT44(iVar5,in_stack_fffffffffffffe48),
                 (HttpServer **)this_00,(_Placeholder<1> *)CONCAT44(iVar4,in_stack_fffffffffffffe38)
                );
      std::function<void(std::shared_ptr<void>)>::
      function<std::_Bind<void(csguide_webserver::HttpServer::*(csguide_webserver::HttpServer*,std::_Placeholder<1>))(std::shared_ptr<void>)>,void>
                ((function<void_(std::shared_ptr<void>)> *)CONCAT44(uVar7,uVar6),
                 (_Bind<void_(csguide_webserver::HttpServer::*(csguide_webserver::HttpServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
                  *)CONCAT44(iVar5,in_stack_fffffffffffffe48));
      ThreadPool::Append(in_stack_fffffffffffffeb8,
                         (shared_ptr<void> *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8);
      std::function<void_(std::shared_ptr<void>)>::~function
                ((function<void_(std::shared_ptr<void>)> *)0x10da4b);
      std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x10da58);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<csguide_webserver::HttpData>_*,_std::vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>_>
      ::operator++(&local_118);
    }
    TimerManager::handle_expired_event(in_stack_fffffffffffffe90);
    std::
    vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
    ::~vector((vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
               *)CONCAT44(uVar7,uVar6));
  } while( true );
}

Assistant:

void HttpServer::Run(int max_queue_size) {
  ThreadPool threadPool(server_conf_.thread_num, max_queue_size);
  int epoll_fd = Epoll::Init(1024);
  std::shared_ptr<HttpData> httpData(new HttpData());
  httpData->epoll_fd = epoll_fd;
  serverSocket.epoll_fd_ = epoll_fd;  // 之前就是这里忘了添加,导致穿进去的serverSocket具有不正确的epoll_fd

  __uint32_t event = (EPOLLIN | EPOLLET);
    Epoll::Addfd(epoll_fd, serverSocket.listen_fd_, event, httpData);

  while (true) {
    std::vector<std::shared_ptr<HttpData>> events = Epoll::Poll(serverSocket, 1024, -1);
    // FIXME 将事件传递给 线程池
    for (auto& req : events) {
        threadPool.Append(req, std::bind(&HttpServer::DoRequest, this, std::placeholders::_1));
    }
    // 处理定时器超时事件
    Epoll::timer_manager_.handle_expired_event();
  }
}